

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void av1_cnn_batchnorm_c(float **image,int channels,int width,int height,int stride,float *gamma,
                        float *beta,float *mean,float *std)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int col;
  int row;
  float *image_row;
  float ch_std;
  float ch_mean;
  float ch_beta;
  float ch_gamma;
  int ch;
  float *gamma_local;
  int stride_local;
  int height_local;
  int width_local;
  int channels_local;
  float **image_local;
  
  for (ch = 0; ch < channels; ch = ch + 1) {
    fVar1 = gamma[ch];
    fVar2 = beta[ch];
    fVar3 = mean[ch];
    fVar4 = std[ch];
    image_row = image[ch];
    for (row = 0; row < height; row = row + 1) {
      for (col = 0; col < width; col = col + 1) {
        image_row[col] = (fVar1 * (image_row[col] - fVar3)) / fVar4 + fVar2;
      }
      image_row = image_row + stride;
    }
  }
  return;
}

Assistant:

void av1_cnn_batchnorm_c(float **image, int channels, int width, int height,
                         int stride, const float *gamma, const float *beta,
                         const float *mean, const float *std) {
  assert(gamma && beta && beta && std && "batchnorm has null parameter!");
  for (int ch = 0; ch < channels; ch++) {
    const float ch_gamma = gamma[ch];
    const float ch_beta = beta[ch];
    const float ch_mean = mean[ch];
    const float ch_std = std[ch];
    float *image_row = image[ch];

    for (int row = 0; row < height; row++) {
      for (int col = 0; col < width; col++) {
        image_row[col] =
            ch_gamma * (image_row[col] - ch_mean) / ch_std + ch_beta;
      }
      image_row += stride;
    }
  }
}